

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O0

size_t __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateParseAuxTable
          (MessageGenerator *this,Printer *printer)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  CppType CVar4;
  CType CVar5;
  Syntax SVar6;
  reference ppFVar7;
  EnumDescriptor *this_00;
  Descriptor *pDVar8;
  string *psVar9;
  size_type sVar10;
  LogMessage *pLVar11;
  mapped_type *pmVar12;
  FileDescriptor *pFVar13;
  ulong uVar14;
  undefined1 qualified;
  char *pcVar15;
  FieldDescriptor *field_00;
  FieldDescriptor *field_01;
  allocator<char> local_481;
  key_type local_480;
  allocator<char> local_459;
  key_type local_458;
  allocator<char> local_431;
  key_type local_430;
  allocator<char> local_409;
  key_type local_408;
  string local_3e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a8;
  allocator<char> local_381;
  key_type local_380;
  byte local_35a;
  byte local_359;
  string local_358;
  byte local_332;
  byte local_331;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_330;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_310;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f0;
  byte local_2ca;
  allocator<char> local_2c9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c8;
  byte local_2a2;
  allocator<char> local_2a1;
  undefined1 local_2a0 [6];
  bool dont_emit_table;
  string local_280;
  allocator<char> local_259;
  key_type local_258;
  string local_238;
  allocator<char> local_211;
  key_type local_210;
  string local_1f0;
  allocator<char> local_1c9;
  key_type local_1c8;
  string local_1a8;
  LogFinisher local_182;
  byte local_181;
  LogMessage local_180;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_148;
  Descriptor *local_130;
  Descriptor *outer;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  package_parts;
  key_type local_108;
  string local_e8;
  undefined1 local_c8 [8];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  vars;
  LogMessage local_90;
  FieldDescriptor *local_58;
  FieldDescriptor *field;
  int local_48;
  int i;
  int last_field_number;
  undefined1 local_38 [8];
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ordered_fields;
  Printer *printer_local;
  MessageGenerator *this_local;
  
  if ((this->table_driven_ & 1U) == 0) {
    this_local = (MessageGenerator *)0x0;
  }
  else {
    ordered_fields.
    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)printer;
    anon_unknown_0::SortFieldsByNumber
              ((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                *)local_38,this->descriptor_);
    io::Printer::Print((Printer *)
                       ordered_fields.
                       super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,
                       "::google::protobuf::internal::AuxillaryParseTableField(),\n");
    local_48 = 1;
    for (field._4_4_ = 0; iVar3 = field._4_4_, iVar2 = Descriptor::field_count(this->descriptor_),
        iVar3 < iVar2; field._4_4_ = field._4_4_ + 1) {
      ppFVar7 = std::
                vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                ::operator[]((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                              *)local_38,(long)field._4_4_);
      local_58 = *ppFVar7;
      vars._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = 0;
      iVar3 = FieldDescriptor::number(local_58);
      if (iVar3 < local_48) {
        internal::LogMessage::LogMessage
                  (&local_90,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_message.cc"
                   ,0x7ae);
        vars._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = 1;
        pLVar11 = internal::LogMessage::operator<<
                            (&local_90,"CHECK failed: (field->number()) >= (last_field_number): ");
        internal::LogFinisher::operator=
                  ((LogFinisher *)((long)&vars._M_t._M_impl.super__Rb_tree_header._M_node_count + 6)
                   ,pLVar11);
      }
      if ((vars._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ & 1) != 0) {
        internal::LogMessage::~LogMessage(&local_90);
      }
      while( true ) {
        iVar3 = local_48;
        iVar2 = FieldDescriptor::number(local_58);
        qualified = (undefined1)iVar2;
        if (iVar2 <= iVar3) break;
        io::Printer::Print((Printer *)
                           ordered_fields.
                           super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage,
                           "::google::protobuf::internal::AuxillaryParseTableField(),\n");
        local_48 = local_48 + 1;
      }
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)local_c8);
      SetCommonFieldVariables
                (local_58,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)local_c8,&this->options_);
      CVar4 = FieldDescriptor::cpp_type(local_58);
      if (CVar4 == CPPTYPE_ENUM) {
        this_00 = FieldDescriptor::enum_type(local_58);
        ClassName_abi_cxx11_(&local_e8,(cpp *)this_00,(EnumDescriptor *)0x1,(bool)qualified);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_108,"type",
                   (allocator<char> *)
                   ((long)&package_parts.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
        pmVar12 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)local_c8,&local_108);
        std::__cxx11::string::operator=((string *)pmVar12,(string *)&local_e8);
        std::__cxx11::string::~string((string *)&local_108);
        std::allocator<char>::~allocator
                  ((allocator<char> *)
                   ((long)&package_parts.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
        std::__cxx11::string::~string((string *)&local_e8);
        io::Printer::Print((Printer *)
                           ordered_fields.
                           super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage,
                           (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)local_c8,
                           "{::google::protobuf::internal::AuxillaryParseTableField::enum_aux{$type$_IsValid, \"$type$\" }},\n"
                          );
        local_48 = local_48 + 1;
      }
      else if (CVar4 == CPPTYPE_STRING) {
        CVar5 = EffectiveStringCType(local_58);
        if (CVar5 == FieldOptions_CType_STRING) {
          local_2ca = 0;
          local_331 = 0;
          local_332 = 0;
          local_359 = 0;
          local_35a = 0;
          FieldDescriptor::default_value_string_abi_cxx11_(local_58);
          uVar14 = std::__cxx11::string::empty();
          if ((uVar14 & 1) == 0) {
            std::operator+(&local_330,"&",&this->classname_);
            local_331 = 1;
            std::operator+(&local_310,&local_330,"::_default_");
            local_332 = 1;
            FieldName_abi_cxx11_(&local_358,(cpp *)local_58,field_01);
            local_359 = 1;
            std::operator+(&local_2f0,&local_310,&local_358);
            local_35a = 1;
            std::operator+(&local_2c8,&local_2f0,"_");
          }
          else {
            std::allocator<char>::allocator();
            local_2ca = 1;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_2c8,
                       "&::google::protobuf::internal::fixed_address_empty_string",&local_2c9);
          }
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_380,"default",&local_381);
          pmVar12 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  *)local_c8,&local_380);
          std::__cxx11::string::operator=((string *)pmVar12,(string *)&local_2c8);
          std::__cxx11::string::~string((string *)&local_380);
          std::allocator<char>::~allocator(&local_381);
          std::__cxx11::string::~string((string *)&local_2c8);
          if ((local_35a & 1) != 0) {
            std::__cxx11::string::~string((string *)&local_2f0);
          }
          if ((local_359 & 1) != 0) {
            std::__cxx11::string::~string((string *)&local_358);
          }
          if ((local_332 & 1) != 0) {
            std::__cxx11::string::~string((string *)&local_310);
          }
          if ((local_331 & 1) != 0) {
            std::__cxx11::string::~string((string *)&local_330);
          }
          if ((local_2ca & 1) != 0) {
            std::allocator<char>::~allocator(&local_2c9);
          }
        }
        else if (CVar5 - FieldOptions_CType_CORD < 2) {
          psVar9 = FieldDescriptor::default_value_string_abi_cxx11_(local_58);
          CEscape(&local_3e8,psVar9);
          std::operator+(&local_3c8,"\"",&local_3e8);
          std::operator+(&local_3a8,&local_3c8,"\"");
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_408,"default",&local_409);
          pmVar12 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  *)local_c8,&local_408);
          std::__cxx11::string::operator=((string *)pmVar12,(string *)&local_3a8);
          std::__cxx11::string::~string((string *)&local_408);
          std::allocator<char>::~allocator(&local_409);
          std::__cxx11::string::~string((string *)&local_3a8);
          std::__cxx11::string::~string((string *)&local_3c8);
          std::__cxx11::string::~string((string *)&local_3e8);
        }
        psVar9 = FieldDescriptor::full_name_abi_cxx11_(local_58);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_430,"full_name",&local_431);
        pmVar12 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)local_c8,&local_430);
        std::__cxx11::string::operator=((string *)pmVar12,(string *)psVar9);
        std::__cxx11::string::~string((string *)&local_430);
        std::allocator<char>::~allocator(&local_431);
        pFVar13 = FieldDescriptor::file(local_58);
        SVar6 = FileDescriptor::syntax(pFVar13);
        pcVar15 = "false";
        if (SVar6 == SYNTAX_PROTO3) {
          pcVar15 = "true";
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_458,"strict",&local_459)
        ;
        pmVar12 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)local_c8,&local_458);
        std::__cxx11::string::operator=((string *)pmVar12,pcVar15);
        std::__cxx11::string::~string((string *)&local_458);
        std::allocator<char>::~allocator(&local_459);
        psVar9 = FieldDescriptor::full_name_abi_cxx11_(local_58);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_480,"type",&local_481);
        pmVar12 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)local_c8,&local_480);
        std::__cxx11::string::operator=((string *)pmVar12,(string *)psVar9);
        std::__cxx11::string::~string((string *)&local_480);
        std::allocator<char>::~allocator(&local_481);
        io::Printer::Print((Printer *)
                           ordered_fields.
                           super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage,
                           (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)local_c8,
                           "{::google::protobuf::internal::AuxillaryParseTableField::string_aux{\n  $default$,\n  \"$full_name$\",\n  $strict$,\n  \"$type$\"\n}},\n"
                          );
        local_48 = local_48 + 1;
      }
      else if (CVar4 == CPPTYPE_MESSAGE) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&outer);
        local_130 = FieldDescriptor::message_type(local_58);
        while (pDVar8 = Descriptor::containing_type(local_130), pDVar8 != (Descriptor *)0x0) {
          local_130 = Descriptor::containing_type(local_130);
        }
        psVar9 = Descriptor::full_name_abi_cxx11_(local_130);
        pcVar15 = (char *)0x1;
        Split(&local_148,psVar9,".",true);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&outer,&local_148);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_148);
        sVar10 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&outer);
        local_181 = 0;
        if (sVar10 == 0) {
          pcVar15 = (char *)0x7cb;
          internal::LogMessage::LogMessage
                    (&local_180,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_message.cc"
                     ,0x7cb);
          local_181 = 1;
          pLVar11 = internal::LogMessage::operator<<
                              (&local_180,"CHECK failed: (package_parts.size()) != (0): ");
          internal::LogFinisher::operator=(&local_182,pLVar11);
        }
        if ((local_181 & 1) != 0) {
          internal::LogMessage::~LogMessage(&local_180);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&outer);
        std::__cxx11::string::clear();
        pDVar8 = FieldDescriptor::message_type(local_58);
        ClassName_abi_cxx11_(&local_1a8,(cpp *)pDVar8,(Descriptor *)0x0,SUB81(pcVar15,0));
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1c8,"classname",&local_1c9);
        pmVar12 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)local_c8,&local_1c8);
        std::__cxx11::string::operator=((string *)pmVar12,(string *)&local_1a8);
        std::__cxx11::string::~string((string *)&local_1c8);
        std::allocator<char>::~allocator(&local_1c9);
        std::__cxx11::string::~string((string *)&local_1a8);
        Join<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                  (&local_1f0,(protobuf *)&outer,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)0x5ff523,pcVar15);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_210,"ns",&local_211);
        pmVar12 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)local_c8,&local_210);
        std::__cxx11::string::operator=((string *)pmVar12,(string *)&local_1f0);
        std::__cxx11::string::~string((string *)&local_210);
        std::allocator<char>::~allocator(&local_211);
        std::__cxx11::string::~string((string *)&local_1f0);
        FieldMessageTypeName_abi_cxx11_(&local_238,(cpp *)local_58,field_00);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_258,"type",&local_259);
        pmVar12 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)local_c8,&local_258);
        std::__cxx11::string::operator=((string *)pmVar12,(string *)&local_238);
        std::__cxx11::string::~string((string *)&local_258);
        std::allocator<char>::~allocator(&local_259);
        std::__cxx11::string::~string((string *)&local_238);
        pFVar13 = Descriptor::file(local_130);
        psVar9 = FileDescriptor::name_abi_cxx11_(pFVar13);
        FileLevelNamespace(&local_280,psVar9);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_2a0,"file_namespace",&local_2a1);
        pmVar12 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)local_c8,(key_type *)local_2a0);
        std::__cxx11::string::operator=((string *)pmVar12,(string *)&local_280);
        std::__cxx11::string::~string((string *)local_2a0);
        std::allocator<char>::~allocator(&local_2a1);
        std::__cxx11::string::~string((string *)&local_280);
        io::Printer::Print((Printer *)
                           ordered_fields.
                           super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage,
                           (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)local_c8,
                           "{::google::protobuf::internal::AuxillaryParseTableField::message_aux{\n  &::$ns$_$classname$_default_instance_,\n"
                          );
        pDVar8 = FieldDescriptor::message_type(local_58);
        bVar1 = anon_unknown_0::TableDrivenEnabled(pDVar8,&this->options_);
        local_2a2 = (bVar1 ^ 0xffU) & 1;
        if (local_2a2 == 0) {
          io::Printer::Print((Printer *)
                             ordered_fields.
                             super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,
                             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)local_c8,
                             "  ::$ns$$file_namespace$::TableStruct::schema +\n    ::$ns$$classname$::kIndexInFileMessages,\n"
                            );
        }
        else {
          io::Printer::Print((Printer *)
                             ordered_fields.
                             super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,"  NULL,\n");
        }
        io::Printer::Print((Printer *)
                           ordered_fields.
                           super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage,"}},\n");
        local_48 = local_48 + 1;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&outer);
      }
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_c8);
    }
    this_local = (MessageGenerator *)(long)local_48;
    std::
    vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
    ::~vector((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
               *)local_38);
  }
  return (size_t)this_local;
}

Assistant:

size_t MessageGenerator::GenerateParseAuxTable(io::Printer* printer) {
  if (!table_driven_) {
    return 0;
  }

  std::vector<const FieldDescriptor*> ordered_fields =
      SortFieldsByNumber(descriptor_);

  printer->Print("::google::protobuf::internal::AuxillaryParseTableField(),\n");
  int last_field_number = 1;
  for (int i = 0; i < descriptor_->field_count(); i++) {
    const FieldDescriptor* field = ordered_fields[i];

    GOOGLE_CHECK_GE(field->number(), last_field_number);
    for (; last_field_number < field->number(); last_field_number++) {
      printer->Print("::google::protobuf::internal::AuxillaryParseTableField(),\n");
    }

    std::map<string, string> vars;
    SetCommonFieldVariables(field, &vars, options_);

    switch (field->cpp_type()) {
      case FieldDescriptor::CPPTYPE_ENUM:
        vars["type"] = ClassName(field->enum_type(), true);
        printer->Print(
            vars,
            "{::google::protobuf::internal::AuxillaryParseTableField::enum_aux{"
            "$type$_IsValid, \"$type$\" }},\n");
        last_field_number++;
        break;
      case FieldDescriptor::CPPTYPE_MESSAGE: {
        std::vector<string> package_parts;

        const Descriptor* outer = field->message_type();
        while (outer->containing_type() != NULL) {
          outer = outer->containing_type();
        }

        package_parts = Split(
            outer->full_name(), ".", true);
        // outer->full_name() contains the class itself.  Remove it as it is
        // used in the name of the default instance variable.
        GOOGLE_DCHECK_NE(package_parts.size(), 0);
        package_parts.back().clear();

        vars["classname"] = ClassName(field->message_type(), false);
        vars["ns"] = Join(package_parts, "::");
        vars["type"] = FieldMessageTypeName(field);
        vars["file_namespace"] = FileLevelNamespace(outer->file()->name());

        printer->Print(vars,
            "{::google::protobuf::internal::AuxillaryParseTableField::message_aux{\n"
            "  &::$ns$_$classname$_default_instance_,\n");

        bool dont_emit_table =
            !TableDrivenEnabled(field->message_type(), options_);

        if (dont_emit_table) {
          printer->Print("  NULL,\n");
        } else {
          printer->Print(vars,
              "  ::$ns$$file_namespace$::TableStruct::schema +\n"
              "    ::$ns$$classname$::kIndexInFileMessages,\n");
        }

        printer->Print("}},\n");
        last_field_number++;
        break;
      }
      case FieldDescriptor::CPPTYPE_STRING:
        switch (EffectiveStringCType(field)) {
          case FieldOptions::STRING:
            vars["default"] =
                field->default_value_string().empty()
                  ? "&::google::protobuf::internal::fixed_address_empty_string"
                  : "&" + classname_ + "::_default_" + FieldName(field) + "_";
            break;
          case FieldOptions::CORD:
          case FieldOptions::STRING_PIECE:
            vars["default"] =
                "\"" + CEscape(field->default_value_string()) + "\"";
            break;
        }
        vars["full_name"] = field->full_name();
        vars["strict"] =
          field->file()->syntax() == FileDescriptor::SYNTAX_PROTO3
          ? "true" : "false";
        vars["type"] = field->full_name();
        printer->Print(vars,
            "{::google::protobuf::internal::AuxillaryParseTableField::string_aux{\n"
            "  $default$,\n"
            "  \"$full_name$\",\n"
            "  $strict$,\n"
            "  \"$type$\"\n"
            "}},\n");
        last_field_number++;
        break;
      default:
        break;
    }
  }

  return last_field_number;
}